

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgqueue.c
# Opt level: O2

int nni_msgq_resize(nni_msgq *mq,int cap)

{
  uint uVar1;
  nni_msg *pnVar2;
  nni_msg **ptr;
  nni_msg **ppnVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  uint uVar10;
  
  uVar10 = cap + 2;
  if (mq->mq_alloc < uVar10) {
    ppnVar3 = (nni_msg **)nni_zalloc((ulong)uVar10 << 3);
    if (ppnVar3 == (nni_msg **)0x0) {
      return 2;
    }
  }
  else {
    ppnVar3 = (nni_msg **)0x0;
  }
  nni_mtx_lock(&mq->mq_lock);
  while (uVar1 = mq->mq_len, cap + 1U < uVar1) {
    uVar5 = mq->mq_get + 1;
    if (mq->mq_alloc < uVar5) {
      uVar5 = 0;
    }
    pnVar2 = mq->mq_msgs[mq->mq_get];
    mq->mq_get = uVar5;
    mq->mq_len = uVar1 - 1;
    nni_msg_free(pnVar2);
  }
  if (ppnVar3 == (nni_msg **)0x0) {
    mq->mq_cap = cap;
  }
  else {
    ptr = mq->mq_msgs;
    uVar5 = mq->mq_alloc;
    uVar4 = mq->mq_get;
    mq->mq_msgs = ppnVar3;
    mq->mq_put = 0;
    mq->mq_len = 0;
    mq->mq_get = 0;
    mq->mq_cap = cap;
    mq->mq_alloc = uVar10;
    uVar7 = 0;
    for (uVar6 = 1; uVar6 - uVar1 != 1; uVar6 = uVar6 + 1) {
      uVar9 = (ulong)uVar4;
      uVar4 = uVar4 + 1;
      pnVar2 = ptr[uVar9];
      uVar8 = uVar7 + 1;
      mq->mq_put = uVar8;
      mq->mq_msgs[uVar7] = pnVar2;
      if (uVar4 == uVar5) {
        uVar4 = 0;
      }
      if (uVar8 == uVar10) {
        mq->mq_put = 0;
        uVar8 = 0;
      }
      mq->mq_len = uVar6;
      uVar7 = uVar8;
    }
    nni_free(ptr,(ulong)uVar5 << 3);
  }
  nni_mtx_unlock(&mq->mq_lock);
  return 0;
}

Assistant:

int
nni_msgq_resize(nni_msgq *mq, int cap)
{
	unsigned  alloc;
	nni_msg  *msg;
	nni_msg **newq, **oldq;
	unsigned  oldget;
	unsigned  oldlen;
	unsigned  oldalloc;

	alloc = cap + 2;

	if (alloc > mq->mq_alloc) {
		newq = nni_zalloc(sizeof(nni_msg *) * alloc);
		if (newq == NULL) {
			return (NNG_ENOMEM);
		}
	} else {
		newq = NULL;
	}

	nni_mtx_lock(&mq->mq_lock);
	while (mq->mq_len > ((unsigned) cap + 1)) {
		// too many messages -- we allow that one for
		// the case of pushback or cap == 0.
		// we delete the oldest messages first
		msg = mq->mq_msgs[mq->mq_get++];
		if (mq->mq_get > mq->mq_alloc) {
			mq->mq_get = 0;
		}
		mq->mq_len--;
		nni_msg_free(msg);
	}
	if (newq == NULL) {
		// Just shrinking the queue, no changes
		mq->mq_cap = cap;
		goto out;
	}

	oldq     = mq->mq_msgs;
	oldget   = mq->mq_get;
	oldalloc = mq->mq_alloc;
	oldlen   = mq->mq_len;

	mq->mq_msgs = newq;
	mq->mq_len = mq->mq_get = mq->mq_put = 0;
	mq->mq_cap                           = cap;
	mq->mq_alloc                         = alloc;

	while (oldlen) {
		mq->mq_msgs[mq->mq_put++] = oldq[oldget++];
		if (oldget == oldalloc) {
			oldget = 0;
		}
		if (mq->mq_put == mq->mq_alloc) {
			mq->mq_put = 0;
		}
		mq->mq_len++;
		oldlen--;
	}
	nni_free(oldq, sizeof(nni_msg *) * oldalloc);

out:
	// Wake everyone up -- we changed everything.
	nni_mtx_unlock(&mq->mq_lock);
	return (0);
}